

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O3

Column_metadata * __thiscall
sqlite::Connection::table_column_metadata
          (Column_metadata *__return_storage_ptr__,Connection *this,string *table_name,
          string *column_name,string *db_name)

{
  char *pcVar1;
  int sqlite_error_code;
  Runtime_error *this_00;
  long *plVar2;
  size_type *psVar3;
  long *plVar4;
  int auto_inc;
  int primary_key;
  int not_null;
  long *local_140;
  long local_138;
  long local_130;
  undefined4 uStack_128;
  undefined4 uStack_124;
  string local_120;
  char *collation;
  char *type;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sqlite_error_code =
       sqlite3_table_column_metadata
                 (this->db_,(db_name->_M_dataplus)._M_p,(table_name->_M_dataplus)._M_p,
                  (column_name->_M_dataplus)._M_p,&type,&collation,&not_null,&primary_key,&auto_inc)
  ;
  if (sqlite_error_code == 0) {
    (__return_storage_ptr__->type)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->type).field_2;
    (__return_storage_ptr__->type)._M_string_length = 0;
    (__return_storage_ptr__->type).field_2._M_local_buf[0] = '\0';
    (__return_storage_ptr__->collation)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->collation).field_2;
    (__return_storage_ptr__->collation)._M_string_length = 0;
    (__return_storage_ptr__->collation).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->not_null = false;
    __return_storage_ptr__->primary_key = false;
    __return_storage_ptr__->auto_inc = false;
    strlen(type);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,(ulong)type);
    pcVar1 = (char *)(__return_storage_ptr__->collation)._M_string_length;
    strlen(collation);
    std::__cxx11::string::_M_replace
              ((ulong)&__return_storage_ptr__->collation,0,pcVar1,(ulong)collation);
    __return_storage_ptr__->not_null = not_null != 0;
    __return_storage_ptr__->primary_key = primary_key != 0;
    __return_storage_ptr__->auto_inc = auto_inc != 0;
    return __return_storage_ptr__;
  }
  sqlite3_close(this->db_);
  this_00 = (Runtime_error *)__cxa_allocate_exception(0x48);
  std::operator+(&local_d0,"Error getting column info (",db_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_b0._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_b0._M_dataplus._M_p == psVar3) {
    local_b0.field_2._M_allocated_capacity = *psVar3;
    local_b0.field_2._8_8_ = plVar2[3];
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  }
  else {
    local_b0.field_2._M_allocated_capacity = *psVar3;
  }
  local_b0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_70,&local_b0,table_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_70);
  local_90._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_90._M_dataplus._M_p == psVar3) {
    local_90.field_2._M_allocated_capacity = *psVar3;
    local_90.field_2._8_8_ = plVar2[3];
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  }
  else {
    local_90.field_2._M_allocated_capacity = *psVar3;
  }
  local_90._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::operator+(&local_50,&local_90,column_name);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_50);
  local_140 = (long *)*plVar2;
  plVar4 = plVar2 + 2;
  if (local_140 == plVar4) {
    local_130 = *plVar4;
    uStack_128 = (undefined4)plVar2[3];
    uStack_124 = *(undefined4 *)((long)plVar2 + 0x1c);
    local_140 = &local_130;
  }
  else {
    local_130 = *plVar4;
  }
  local_138 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  sqlite3_errmsg(this->db_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_140);
  local_120._M_dataplus._M_p = (pointer)*plVar2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)local_120._M_dataplus._M_p == psVar3) {
    local_120.field_2._M_allocated_capacity = *psVar3;
    local_120.field_2._8_4_ = (undefined4)plVar2[3];
    local_120.field_2._12_4_ = *(undefined4 *)((long)plVar2 + 0x1c);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
  }
  else {
    local_120.field_2._M_allocated_capacity = *psVar3;
  }
  local_120._M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"");
  Runtime_error::Runtime_error(this_00,&local_120,&local_f0,sqlite_error_code,(sqlite3 *)0x0);
  __cxa_throw(this_00,&Runtime_error::typeinfo,Runtime_error::~Runtime_error);
}

Assistant:

Connection::Column_metadata Connection::table_column_metadata(const std::string & table_name, const std::string & column_name,
        const std::string & db_name)
    {
        const char * type, * collation;
        int not_null, primary_key, auto_inc;

        int status = sqlite3_table_column_metadata(db_, db_name.c_str(), table_name.c_str(), column_name.c_str(),
            &type, &collation, &not_null, &primary_key, &auto_inc);

        if(status != SQLITE_OK)
        {
            sqlite3_close(db_);
            throw Runtime_error("Error getting column info (" +
                db_name + "." + table_name + "." + column_name + "): " +
                sqlite3_errmsg(db_), "", status, nullptr);
        }

        Column_metadata ret;
        ret.type = type;
        ret.collation = collation;
        ret.not_null = bool(not_null);
        ret.primary_key = bool(primary_key);
        ret.auto_inc = bool(auto_inc);

        return ret;
    }